

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

void YAML::Utils::anon_unknown_0::WriteDoubleQuoteEscapeSequence
               (ostream_wrapper *out,int codePoint,value stringEscapingStyle)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  char *str;
  int iVar5;
  bool bVar6;
  
  uVar3 = (ulong)(uint)codePoint;
  bVar6 = stringEscapingStyle != JSON;
  iVar5 = 2;
  str = "x";
  do {
    YAML::operator<<(out,(char (*) [2])0x6ebea2);
    uVar2 = (uint)uVar3;
    if ((bool)((int)uVar2 < 0xff & bVar6)) {
LAB_0069e447:
      YAML::operator<<(out,(char (*) [2])str);
      iVar4 = iVar5 * 4;
      while( true ) {
        iVar4 = iVar4 + -4;
        if (iVar5 < 1) break;
        YAML::operator<<(out,"0123456789abcdef"[(int)uVar2 >> ((byte)iVar4 & 0x1f) & 0xf]);
        iVar5 = iVar5 + -1;
      }
      return;
    }
    if ((int)uVar2 < 0xffff || bVar6) {
      str = "U";
      if ((int)uVar2 < 0xffff) {
        str = "u";
      }
      iVar5 = (uint)(0xfffe < (int)uVar2) * 4 + 4;
      goto LAB_0069e447;
    }
    uVar1 = uVar3 >> 10;
    uVar3 = (ulong)(uVar2 & 0x3ff | 0xdc00);
    WriteDoubleQuoteEscapeSequence(out,(uint)uVar1 & 0xffff | 0xd7c0,JSON);
    bVar6 = false;
  } while( true );
}

Assistant:

void WriteDoubleQuoteEscapeSequence(ostream_wrapper& out, int codePoint, StringEscaping::value stringEscapingStyle) {
  static const char hexDigits[] = "0123456789abcdef";

  out << "\\";
  int digits = 8;
  if (codePoint < 0xFF && stringEscapingStyle != StringEscaping::JSON) {
    out << "x";
    digits = 2;
  } else if (codePoint < 0xFFFF) {
    out << "u";
    digits = 4;
  } else if (stringEscapingStyle != StringEscaping::JSON) {
    out << "U";
    digits = 8;
  } else {
    auto surrogatePair = EncodeUTF16SurrogatePair(codePoint);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.first, stringEscapingStyle);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.second, stringEscapingStyle);
    return;
  }

  // Write digits into the escape sequence
  for (; digits > 0; --digits)
    out << hexDigits[(codePoint >> (4 * (digits - 1))) & 0xF];
}